

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::SetHasNewPolyFieldAccess
          (DynamicProfileInfo *this,FunctionBody *functionBody)

{
  bool bVar1;
  uint32 uVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  ScriptContext *this_00;
  ThreadContext *this_01;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  this_01 = ScriptContext::GetThreadContext(this_00);
  uVar2 = ThreadContext::GetNextPolymorphicCacheState(this_01);
  this->polymorphicCacheState = uVar2;
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,sourceContextId,functionId);
  if (bVar1) {
    Output::Print(L"New profile cache state: %d\n",(ulong)this->polymorphicCacheState);
    Output::Flush();
  }
  return;
}

Assistant:

void DynamicProfileInfo::SetHasNewPolyFieldAccess(FunctionBody *functionBody)
    {
        this->polymorphicCacheState = functionBody->GetScriptContext()->GetThreadContext()->GetNextPolymorphicCacheState();

        PHASE_PRINT_TRACE(
            Js::ObjTypeSpecPhase, functionBody,
            _u("New profile cache state: %d\n"), this->polymorphicCacheState);
    }